

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

PackageSymbol * __thiscall
slang::ast::Compilation::createPackage
          (Compilation *this,Scope *scope,ModuleDeclarationSyntax *syntax)

{
  bool bVar1;
  type *this_00;
  type_conflict2 *ptVar2;
  Diagnostic *this_01;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>
  *ppVar3;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_bool>
  pVar4;
  Diagnostic *diag;
  type_conflict2 *inserted;
  type *it;
  PackageSymbol *local_60;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_bool>
  local_58;
  _Storage<slang::TimeScale,_true> local_48;
  uint local_44;
  _Storage<slang::TimeScale,_true> local_40;
  undefined1 local_3c;
  PackageSymbol *local_38;
  PackageSymbol *package;
  DefinitionMetadata *local_28;
  DefinitionMetadata *metadata;
  ModuleDeclarationSyntax *syntax_local;
  Scope *scope_local;
  Compilation *this_local;
  
  package = (PackageSymbol *)syntax;
  metadata = (DefinitionMetadata *)syntax;
  syntax_local = (ModuleDeclarationSyntax *)scope;
  scope_local = (Scope *)this;
  local_28 = ska::
             flat_hash_map<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>
             ::operator[](&this->definitionMetadata,(ModuleDeclarationSyntax **)&package);
  local_3c = (local_28->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_48 = (local_28->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_44 = CONCAT31(local_44._1_3_,local_3c);
  local_40 = local_48;
  local_60 = PackageSymbol::fromSyntax
                       ((Scope *)syntax_local,(ModuleDeclarationSyntax *)metadata,
                        local_28->defaultNetType,
                        (optional<slang::TimeScale>)
                        ((uint5)(uint)local_48 | (uint5)local_44 << 0x20));
  local_38 = local_60;
  pVar4 = ska::detailv3::
          sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
          ::emplace<std::basic_string_view<char,std::char_traits<char>>&,slang::ast::PackageSymbol*>
                    ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
                      *)&this->packageMap,&(local_60->super_Symbol).name,&local_60);
  local_58.first = pVar4.first.current;
  local_58.second = pVar4.second;
  this_00 = std::
            get<0ul,ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>::templated_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,bool>
                      (&local_58);
  ptVar2 = std::
           get<1ul,ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>::templated_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,bool>
                     (&local_58);
  if ((*ptVar2 & 1U) == 0) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      (&(local_38->super_Symbol).name);
    if (!bVar1) {
      this_01 = Scope::addDiag((Scope *)syntax_local,(DiagCode)0x24000a,
                               (local_38->super_Symbol).location);
      Diagnostic::operator<<(this_01,(local_38->super_Symbol).name);
      ppVar3 = ska::detailv3::
               sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>
               ::
               templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>
               ::operator->(this_00);
      Diagnostic::addNote(this_01,(DiagCode)0x80001,(ppVar3->second->super_Symbol).location);
    }
  }
  return local_38;
}

Assistant:

const PackageSymbol& Compilation::createPackage(const Scope& scope,
                                                const ModuleDeclarationSyntax& syntax) {
    auto& metadata = definitionMetadata[&syntax];
    auto& package = PackageSymbol::fromSyntax(scope, syntax, *metadata.defaultNetType,
                                              metadata.timeScale);

    auto [it, inserted] = packageMap.emplace(package.name, &package);
    if (!inserted && !package.name.empty()) {
        auto& diag = scope.addDiag(diag::Redefinition, package.location);
        diag << package.name;
        diag.addNote(diag::NotePreviousDefinition, it->second->location);
    }

    return package;
}